

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computationTest.cpp
# Opt level: O2

void __thiscall Computation_FG_Test::TestBody(Computation_FG_Test *this)

{
  lattice *grid;
  int iVar1;
  uint uVar2;
  double **field;
  double dVar3;
  double **F;
  double **G;
  double **RHS;
  char **FLAG;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  double errRHS;
  double errG;
  double errF;
  double init [3];
  fluidSim local_78;
  
  init[2] = 0.0;
  init[0] = 0.773;
  init[1] = 14.567;
  grid = &(this->super_Computation).grid;
  initUVP(&(this->super_Computation).U,&(this->super_Computation).V,&(this->super_Computation).P,
          (this->super_Computation).grid.deli,(this->super_Computation).grid.delj,init);
  F = create2Dfield((this->super_Computation).grid.deli + 1,(this->super_Computation).grid.delj + 1)
  ;
  G = create2Dfield((this->super_Computation).grid.deli + 1,(this->super_Computation).grid.delj + 1)
  ;
  RHS = create2Dfield((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  FLAG = create2DIntegerField
                   ((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  local_78.Re = 1000.0;
  local_78.alpha = 0.0;
  local_78.GX = 0.0;
  local_78.GY = 0.0;
  compFG((this->super_Computation).U,(this->super_Computation).V,F,G,FLAG,0.5,grid,&local_78);
  compRHS(F,G,RHS,grid,0.5);
  errF = 0.0;
  errG = 0.0;
  errRHS = 0.0;
  iVar1 = (this->super_Computation).grid.deli;
  uVar2 = (this->super_Computation).grid.delj;
  field = (this->super_Computation).U;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  iVar5 = 0;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  dVar3 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  for (uVar6 = 1; uVar6 != iVar5 + 1; uVar6 = uVar6 + 1) {
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      dVar11 = F[uVar6 - 1][uVar8 + 1] - field[uVar6][uVar8 + 1];
      dVar10 = dVar10 + dVar11 * dVar11;
      dVar11 = G[uVar6][uVar8] - (this->super_Computation).V[uVar6][uVar8 + 1];
      dVar9 = dVar9 + dVar11 * dVar11;
      dVar3 = dVar3 + RHS[uVar6 - 1][uVar8] * RHS[uVar6 - 1][uVar8];
      errRHS = dVar3;
      errG = dVar9;
      errF = dVar10;
    }
  }
  destroy2Dfield(field,iVar1 + 3);
  destroy2Dfield((this->super_Computation).V,(this->super_Computation).grid.deli + 2);
  destroy2Dfield((this->super_Computation).P,(this->super_Computation).grid.deli + 2);
  destroy2Dfield(F,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(G,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(RHS,(this->super_Computation).grid.deli);
  destroy2Dfield(FLAG,(this->super_Computation).grid.deli + 2);
  local_d0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f1a36e2eb1c432d
  ;
  testing::internal::CmpHelperLE<double,double>
            ((internal *)&gtest_ar,"errF","1e-4",&errF,(double *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f1a36e2eb1c432d
  ;
  testing::internal::CmpHelperLE<double,double>
            ((internal *)&gtest_ar,"errG","1e-4",&errG,(double *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f1a36e2eb1c432d
  ;
  testing::internal::CmpHelperLE<double,double>
            ((internal *)&gtest_ar,"errRHS","1e-4",&errRHS,(double *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Computation, FG)
{
	REAL init[3] = {0.773,14.567,0};
	initUVP(&U,&V,&P,grid.deli,grid.delj,init);
	REAL **F = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **G = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **rhs = create2Dfield(grid.deli,grid.delj);
	char **FLAG = create2DIntegerField(grid.deli,grid.delj);

	fluidSim sim;
	sim.Re = 1000;
	sim.GX = 0;
	sim.GY = 0;
	sim.alpha = 0;
	compFG(U,V,F,G,FLAG,0.5,&grid,&sim);
	compRHS(F,G,rhs,&grid,0.5);
	REAL errF = 0, errG = 0, errRHS = 0;
	for (int i = 1; i <= grid.deli; i++)
		for (int j = 1; j <= grid.delj; j++)
		{
			errF += sqr(F[i-1][j] - U[i][j]);
			errG += sqr(G[i][j-1] - V[i][j]);
			errRHS += sqr(rhs[i-1][j-1]);
		}

	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	destroy2Dfield((void**)F,grid.deli+1);
	destroy2Dfield((void**)G,grid.deli+1);
	destroy2Dfield((void**)rhs,grid.deli);
	destroy2Dfield((void**)FLAG,grid.deli+2);

	EXPECT_LE(errF,1e-4);
	EXPECT_LE(errG,1e-4);
	EXPECT_LE(errRHS,1e-4);
}